

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

int __thiscall deqp::gls::TextureBufferCase::init(TextureBufferCase *this,EVP_PKEY_CTX *ctx)

{
  RenderBits RVar1;
  TestLog *pTVar2;
  bool bVar3;
  ContextType CVar4;
  int iVar5;
  ContextInfo *this_00;
  ShaderProgram *pSVar6;
  NotSupportedError *pNVar7;
  TestError *pTVar8;
  char *pcVar9;
  char *__end;
  char *pcVar10;
  ScopedLogSection section;
  ScopedLogSection local_80;
  ContextInfo *local_78;
  string local_70;
  string local_50;
  
  this_00 = glu::ContextInfo::create(this->m_renderCtx);
  local_78 = this_00;
  CVar4.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar4,(ApiType)0x133);
  if (!bVar3) {
    CVar4.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    bVar3 = glu::contextSupports(CVar4,(ApiType)0x13);
    if (bVar3) {
      bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
      if (bVar3) goto LAB_0189256d;
    }
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar7,"Texture buffers not supported",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x3c7);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0189256d:
  iVar5 = (*this_00->_vptr_ContextInfo[2])(this_00,0x8c2b);
  if (iVar5 < 1) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar7,"GL_MAX_TEXTURE_BUFFER_SIZE > 0 required",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x3cc);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_preRender != RENDERBITS_NONE) {
    pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    bVar3 = this->m_postRender != RENDERBITS_NONE;
    pcVar9 = "Primary render program";
    if (!bVar3) {
      pcVar9 = "Render program";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar9,pcVar9 + (ulong)bVar3 * 8 + 0xe);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar9,pcVar9 + (ulong)bVar3 * 8 + 0xe);
    tcu::ScopedLogSection::ScopedLogSection(&local_80,pTVar2,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pSVar6 = anon_unknown_1::createRenderProgram(this->m_renderCtx,this->m_preRender);
    this->m_preRenderProgram = pSVar6;
    glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,pSVar6);
    if ((this->m_preRenderProgram->m_program).m_info.linkOk == false) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,"m_preRenderProgram->isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x3d8);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    tcu::TestLog::endSection(local_80.m_log);
  }
  if (this->m_postRender != RENDERBITS_NONE) {
    RVar1 = this->m_preRender;
    if (RVar1 == this->m_postRender) {
      this->m_postRenderProgram = this->m_preRenderProgram;
    }
    else {
      pcVar9 = "Secondary render program";
      if (RVar1 == RENDERBITS_NONE) {
        pcVar9 = "Render program";
      }
      pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      pcVar10 = pcVar9 + 0x18;
      if (RVar1 == RENDERBITS_NONE) {
        pcVar10 = pcVar9 + 0xe;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar9,pcVar10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar9,pcVar10);
      tcu::ScopedLogSection::ScopedLogSection(&local_80,pTVar2,&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      this_00 = local_78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pSVar6 = anon_unknown_1::createRenderProgram(this->m_renderCtx,this->m_postRender);
      this->m_postRenderProgram = pSVar6;
      glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,pSVar6);
      if ((this->m_postRenderProgram->m_program).m_info.linkOk == false) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,"m_postRenderProgram->isOk()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x3eb);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      tcu::TestLog::endSection(local_80.m_log);
    }
  }
  iVar5 = (*this_00->_vptr_ContextInfo[1])(this_00);
  return iVar5;
}

Assistant:

void TextureBufferCase::init (void)
{
	de::UniquePtr<glu::ContextInfo> info (glu::ContextInfo::create(m_renderCtx));

	if (!glu::contextSupports(m_renderCtx.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE))
		&& !(glu::contextSupports(m_renderCtx.getType(), glu::ApiType(3, 1, glu::PROFILE_ES)) && info->isExtensionSupported("GL_EXT_texture_buffer")))
		throw tcu::NotSupportedError("Texture buffers not supported", "", __FILE__, __LINE__);

	{
		const int maxTextureBufferSize = info->getInt(GL_MAX_TEXTURE_BUFFER_SIZE);
		if (maxTextureBufferSize <= 0)
			TCU_THROW(NotSupportedError, "GL_MAX_TEXTURE_BUFFER_SIZE > 0 required");
	}

	if (m_preRender != 0)
	{
		TestLog&					log			= m_testCtx.getLog();
		const char* const			sectionName	= (m_postRender != 0 ? "Primary render program" : "Render program");
		const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

		m_preRenderProgram = createRenderProgram(m_renderCtx, m_preRender);
		m_testCtx.getLog() << (*m_preRenderProgram);

		TCU_CHECK(m_preRenderProgram->isOk());
	}

	if (m_postRender != 0)
	{
		// Reusing program
		if (m_preRender == m_postRender)
		{
			m_postRenderProgram = m_preRenderProgram;
		}
		else
		{
			TestLog&					log			= m_testCtx.getLog();
			const char* const			sectionName	= (m_preRender!= 0 ? "Secondary render program" : "Render program");
			const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

			m_postRenderProgram = createRenderProgram(m_renderCtx, m_postRender);
			m_testCtx.getLog() << (*m_postRenderProgram);

			TCU_CHECK(m_postRenderProgram->isOk());
		}
	}
}